

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e-hierarchy-trainer.cc
# Opt level: O3

void ReadSentencePair(string *line,vector<int,_std::allocator<int>_> *s,Dict *sd,
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *c,Dict *cd,
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *l,Dict *ld,int *unk,int *total)

{
  byte bVar1;
  iterator iVar2;
  pointer pvVar3;
  bool bVar4;
  size_type sVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  vector<int,_std::allocator<int>_> ctmp;
  string sep;
  int k;
  istringstream in;
  int local_24c;
  string local_248;
  vector<int,_std::allocator<int>_> local_228;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_210;
  Dict *local_208;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_200;
  long local_1f8;
  undefined1 *local_1f0;
  size_t local_1e8;
  undefined1 local_1e0 [16];
  string local_1d0;
  long local_1b0 [4];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  local_210 = l;
  local_208 = sd;
  local_200 = c;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)line,_S_in);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_1f0 = local_1e0;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"|||","");
  if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) == 0) {
    lVar9 = 0;
    do {
      local_1f8 = lVar9 * 3;
      while( true ) {
        std::operator>>((istream *)local_1b0,(string *)&local_248);
        sVar5 = local_248._M_string_length;
        if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) != 0) goto LAB_00162566;
        if ((local_248._M_string_length == local_1e8) &&
           ((local_248._M_string_length == 0 ||
            (iVar6 = bcmp(local_248._M_dataplus._M_p,local_1f0,local_248._M_string_length),
            iVar6 == 0)))) break;
        if ((int)lVar9 == 1) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(local_210,
                   (long)(s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2);
LAB_00162799:
          pvVar3 = (local_210->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          iVar6 = cnn::Dict::Convert(ld,&local_248);
          local_1d0._M_dataplus._M_p._0_4_ = iVar6;
          iVar2._M_current = *(int **)((long)pvVar3 + local_1f8 * 8 + -0x10);
          if (iVar2._M_current == *(int **)((long)pvVar3 + local_1f8 * 8 + -8)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + local_1f8 * 8),iVar2,(int *)&local_1d0);
          }
          else {
            *iVar2._M_current = iVar6;
            *(int **)((long)pvVar3 + local_1f8 * 8 + -0x10) = iVar2._M_current + 1;
          }
        }
        else {
          if ((int)lVar9 != 0) goto LAB_00162799;
          *total = *total + 1;
          local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (int *)0x0;
          local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          if (sVar5 != 0) {
            uVar8 = 1;
            do {
              local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_1d0,'\x01');
              local_24c = cnn::Dict::Convert(cd,&local_1d0);
              if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_228,
                           (iterator)
                           local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_24c);
              }
              else {
                *local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_24c;
                local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p);
              }
              bVar4 = uVar8 < local_248._M_string_length;
              uVar8 = (ulong)((int)uVar8 + 1);
            } while (bVar4);
          }
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::push_back(local_200,&local_228);
          if (local_248._M_string_length != 0) {
            uVar7 = 1;
            uVar8 = 0;
            do {
              bVar1 = local_248._M_dataplus._M_p[uVar8];
              if ('/' < (char)bVar1) {
                bVar10 = 0x30;
                if (0x39 < bVar1) {
                  if (0x19 < (byte)(bVar1 + 0xbf)) goto LAB_00162739;
                  bVar10 = bVar1 | 0x20;
                }
                local_248._M_dataplus._M_p[uVar8] = bVar10;
              }
LAB_00162739:
              uVar8 = (ulong)uVar7;
              uVar7 = uVar7 + 1;
            } while (uVar8 < local_248._M_string_length);
          }
          iVar6 = cnn::Dict::Convert(local_208,&local_248);
          local_1d0._M_dataplus._M_p._0_4_ = iVar6;
          if (iVar6 == kUNK) {
            *unk = *unk + 1;
          }
          iVar2._M_current =
               (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar2._M_current ==
              (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)s,iVar2,(int *)&local_1d0);
          }
          else {
            *iVar2._M_current = iVar6;
            (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar2._M_current + 1;
          }
          if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) != 0) goto LAB_00162566;
      }
      lVar9 = lVar9 + 1;
    } while( true );
  }
LAB_00162566:
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void ReadSentencePair(const string& line, vector<int>* s, cnn::Dict* sd, vector< vector<int> >* c, cnn::Dict* cd, vector< vector<int> >& l, cnn::Dict* ld, int& unk, int& total){
  istringstream in(line);
  string word;
  string sep = "|||";
  int f = 0;

  while(in) {
    in >> word;
    if (!in) break;

    if (word == sep) { f+=1; continue; }
    
    if(f == 0) {
      total += 1;
      vector<int> ctmp;
      for(unsigned i = 0; i < word.size(); i ++){
        ctmp.push_back(cd->Convert(string(1,word[i])));
      }
      c->push_back(ctmp);
      normalize_digital_lower(word);
      int k = sd->Convert(word);
      if(k == kUNK) unk++;
      s->push_back(k);
    }
    else {
      if(f == 1) l.resize(s->size());
      l[f-1].push_back(ld->Convert(word));
    }
  }
}